

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O0

int v3_check_generic(char **value)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  byte *local_28;
  char *p;
  int gen_type;
  char **value_local;
  
  __s = *value;
  sVar2 = strlen(__s);
  if ((sVar2 < 4) || (iVar1 = strncmp(__s,"DER:",4), iVar1 != 0)) {
    sVar2 = strlen(__s);
    if ((sVar2 < 5) || (iVar1 = strncmp(__s,"ASN1:",5), iVar1 != 0)) {
      return 0;
    }
    local_28 = (byte *)(__s + 5);
    p._4_4_ = 2;
  }
  else {
    local_28 = (byte *)(__s + 4);
    p._4_4_ = 1;
  }
  while (iVar1 = OPENSSL_isspace((uint)*local_28), iVar1 != 0) {
    local_28 = local_28 + 1;
  }
  *value = (char *)local_28;
  return p._4_4_;
}

Assistant:

static int v3_check_generic(const char **value) {
  int gen_type = 0;
  const char *p = *value;
  if ((strlen(p) >= 4) && !strncmp(p, "DER:", 4)) {
    p += 4;
    gen_type = 1;
  } else if ((strlen(p) >= 5) && !strncmp(p, "ASN1:", 5)) {
    p += 5;
    gen_type = 2;
  } else {
    return 0;
  }

  while (OPENSSL_isspace((unsigned char)*p)) {
    p++;
  }
  *value = p;
  return gen_type;
}